

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::InternalSwap
          (SimpleRecurrentLayerParams *this,SimpleRecurrentLayerParams *other)

{
  SimpleRecurrentLayerParams *other_local;
  SimpleRecurrentLayerParams *this_local;
  
  std::swap<CoreML::Specification::ActivationParams*>(&this->activation_,&other->activation_);
  std::swap<CoreML::Specification::WeightParams*>(&this->weightmatrix_,&other->weightmatrix_);
  std::swap<CoreML::Specification::WeightParams*>(&this->recursionmatrix_,&other->recursionmatrix_);
  std::swap<CoreML::Specification::WeightParams*>(&this->biasvector_,&other->biasvector_);
  std::swap<unsigned_long>(&this->inputvectorsize_,&other->inputvectorsize_);
  std::swap<unsigned_long>(&this->outputvectorsize_,&other->outputvectorsize_);
  std::swap<bool>(&this->sequenceoutput_,&other->sequenceoutput_);
  std::swap<bool>(&this->hasbiasvector_,&other->hasbiasvector_);
  std::swap<bool>(&this->reverseinput_,&other->reverseinput_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void SimpleRecurrentLayerParams::InternalSwap(SimpleRecurrentLayerParams* other) {
  std::swap(activation_, other->activation_);
  std::swap(weightmatrix_, other->weightmatrix_);
  std::swap(recursionmatrix_, other->recursionmatrix_);
  std::swap(biasvector_, other->biasvector_);
  std::swap(inputvectorsize_, other->inputvectorsize_);
  std::swap(outputvectorsize_, other->outputvectorsize_);
  std::swap(sequenceoutput_, other->sequenceoutput_);
  std::swap(hasbiasvector_, other->hasbiasvector_);
  std::swap(reverseinput_, other->reverseinput_);
  std::swap(_cached_size_, other->_cached_size_);
}